

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmTexture.cpp
# Opt level: O2

bool __thiscall
GmmLib::GmmTextureCalc::GmmGetD3DToHwTileConversion
          (GmmTextureCalc *this,GMM_TEXTURE_INFO *pTexInfo,uint32_t *pColFactor,uint32_t *pRowFactor
          )

{
  anon_struct_8_44_94931171_for_Info aVar1;
  bool bVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint uVar5;
  
  uVar4 = pTexInfo->BitsPerPixel;
  if (((uVar4 - 8 < 0x39) && ((0x100000001000101U >> ((ulong)(uVar4 - 8) & 0x3f) & 1) != 0)) ||
     (uVar4 == 0x80)) {
    aVar1 = (pTexInfo->Flags).Info;
    if (((ulong)aVar1 & 0x104000080000) != 0) {
      *pColFactor = 1;
      bVar2 = true;
      uVar5 = 1;
      goto LAB_001b77ce;
    }
    if (((ulong)aVar1 & 0x81000000000) != 0) {
      uVar3 = __GmmLog2(uVar4);
      uVar4 = __GmmTileYConversionTable[uVar3 - 3][1];
      *pColFactor = __GmmTileYConversionTable[uVar3 - 3][0];
      *pRowFactor = uVar4;
      uVar5 = (pTexInfo->MSAA).NumSamples;
      if (uVar5 < 2) {
        return true;
      }
      uVar4 = __GmmLog2(uVar5);
      uVar3 = __GmmLog2((pTexInfo->MSAA).NumSamples);
      *pColFactor = *pColFactor / __GmmMSAAConversion[uVar4][0];
      uVar5 = *pRowFactor / __GmmMSAAConversion[uVar3][1];
      bVar2 = true;
      goto LAB_001b77ce;
    }
  }
  *pColFactor = 0;
  uVar5 = 0;
  bVar2 = false;
LAB_001b77ce:
  *pRowFactor = uVar5;
  return bVar2;
}

Assistant:

bool GmmLib::GmmTextureCalc::GmmGetD3DToHwTileConversion(GMM_TEXTURE_INFO *pTexInfo,
                                                         uint32_t *        pColFactor,
                                                         uint32_t *        pRowFactor)
{
    uint32_t i   = 0;
    uint32_t Bpp = pTexInfo->BitsPerPixel;

    // check for  unsupported bpp
    if(!(Bpp == 8 || Bpp == 16 || Bpp == 32 || Bpp == 64 || Bpp == 128))
    {
        __GMM_ASSERT(false);
        goto EXIT_ERROR;
    }

    // for TileYS, no conversion
    if(GMM_IS_64KB_TILE(pTexInfo->Flags) || pTexInfo->Flags.Info.Linear)
    {
        *pColFactor = 1;
        *pRowFactor = 1;
    }
    else if(GMM_IS_4KB_TILE(pTexInfo->Flags))
    {
        // Logic for non-MSAA
        {
            //      Bpp = 8      => i = 0           , Bpp = 16 => i = 1, ...
            // Log2(Bpp = 8) = 3 => i = Log2(8) - 3.

            i           = __GmmLog2(Bpp) - 3;
            *pColFactor = __GmmTileYConversionTable[i][0];
            *pRowFactor = __GmmTileYConversionTable[i][1];
        }

        // Logic for MSAA
        if(pTexInfo->MSAA.NumSamples > 1)
        {

            // For MSAA, the DirectX tile dimensions change, using the table __GmmMSAAConversion.
            uint32_t W = __GmmMSAAConversion[__GmmLog2(pTexInfo->MSAA.NumSamples)][0];
            uint32_t H = __GmmMSAAConversion[__GmmLog2(pTexInfo->MSAA.NumSamples)][1];

            // For the new DirectX tile dimensions the new Col and Row conversion factors are:
            *pColFactor /= W;
            *pRowFactor /= H;
        }
    }
    else
    {
        // unsupported format.
        __GMM_ASSERT(false);
        goto EXIT_ERROR;
    }

    return true;

EXIT_ERROR:
    *pColFactor = 0;
    *pRowFactor = 0;
    return false;
}